

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

int __thiscall lzham::lzcompressor::state::init(state *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  raw_quasi_adaptive_huffman_data_model *this_00;
  long lVar3;
  
  (this->super_state_base).m_cur_ofs = 0;
  (this->super_state_base).m_cur_state = 0;
  lVar3 = 3;
  this_00 = &this->m_rep_len_table[0].super_raw_quasi_adaptive_huffman_data_model;
  do {
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      iVar1 = raw_quasi_adaptive_huffman_data_model::init
                        (&(this->m_main_table).super_raw_quasi_adaptive_huffman_data_model,
                         (EVP_PKEY_CTX *)0x1);
      if ((char)iVar1 == '\0') {
        return 0;
      }
      iVar1 = raw_quasi_adaptive_huffman_data_model::init
                        (&(this->m_dist_lsb_table).super_raw_quasi_adaptive_huffman_data_model,
                         (EVP_PKEY_CTX *)0x1);
      if ((char)iVar1 == '\0') {
        return 0;
      }
      lVar3 = 0x698;
      do {
        if (lVar3 + 0x80 == 0x2718) {
          lVar3 = 0x2698;
          do {
            if (lVar3 + 0x80 == 0x4718) {
              (this->super_state_base).m_match_hist[0] = 1;
              (this->super_state_base).m_match_hist[1] = 1;
              (this->super_state_base).m_match_hist[2] = 1;
              (this->super_state_base).m_match_hist[3] = 1;
              (this->super_state_base).m_cur_ofs = 0;
              return (int)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
            }
            iVar2 = raw_quasi_adaptive_huffman_data_model::init
                              ((raw_quasi_adaptive_huffman_data_model *)
                               ((long)(this->super_state_base).m_match_hist + lVar3 + -8),
                               (EVP_PKEY_CTX *)0x1);
            iVar1 = 0;
            lVar3 = lVar3 + 0x80;
          } while ((char)iVar2 != '\0');
          return 0;
        }
        iVar1 = raw_quasi_adaptive_huffman_data_model::init
                          ((raw_quasi_adaptive_huffman_data_model *)
                           ((long)(this->super_state_base).m_match_hist + lVar3 + -8),
                           (EVP_PKEY_CTX *)0x1);
        lVar3 = lVar3 + 0x80;
      } while ((char)iVar1 != '\0');
      return 0;
    }
    iVar1 = raw_quasi_adaptive_huffman_data_model::init(this_00,(EVP_PKEY_CTX *)0x1);
    if ((char)iVar1 == '\0') {
      return 0;
    }
    iVar1 = raw_quasi_adaptive_huffman_data_model::init
                      ((raw_quasi_adaptive_huffman_data_model *)&this_00[3].m_codes,
                       (EVP_PKEY_CTX *)0x1);
    this_00 = (raw_quasi_adaptive_huffman_data_model *)&this_00[1].m_pDecode_tables;
  } while ((char)iVar1 != '\0');
  return 0;
}

Assistant:

bool lzcompressor::state::init(CLZBase& lzbase, bool fast_adaptive_huffman_updating, bool use_polar_codes)
   {
      m_cur_ofs = 0;
      m_cur_state = 0;

      for (uint i = 0; i < 2; i++)
      {
         if (!m_rep_len_table[i].init(true, CLZBase::cMaxMatchLen - CLZBase::cMinMatchLen + 1, fast_adaptive_huffman_updating, use_polar_codes)) return false;
         if (!m_large_len_table[i].init(true, CLZBase::cLZXNumSecondaryLengths, fast_adaptive_huffman_updating, use_polar_codes)) return false;
      }
      if (!m_main_table.init(true, CLZBase::cLZXNumSpecialLengths + (lzbase.m_num_lzx_slots - CLZBase::cLZXLowestUsableMatchSlot) * 8, fast_adaptive_huffman_updating, use_polar_codes)) return false;
      if (!m_dist_lsb_table.init(true, 16, fast_adaptive_huffman_updating, use_polar_codes)) return false;

      for (uint i = 0; i < (1 << CLZBase::cNumLitPredBits); i++)
      {
         if (!m_lit_table[i].init(true, 256, fast_adaptive_huffman_updating, use_polar_codes)) return false;
      }

      for (uint i = 0; i < (1 << CLZBase::cNumDeltaLitPredBits); i++)
      {
         if (!m_delta_lit_table[i].init(true, 256, fast_adaptive_huffman_updating, use_polar_codes)) return false;
      }

      m_match_hist[0] = 1;
      m_match_hist[1] = 1;
      m_match_hist[2] = 1;
      m_match_hist[3] = 1;

      m_cur_ofs = 0;

      return true;
   }